

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::sendWebSocketError(Connection *this,StringPtr errorMessage)

{
  size_t in_RCX;
  StringPtr *in_R8;
  undefined1 local_210 [64];
  StringPtr errorMessage_local;
  Array<char> local_1c0;
  Exception exception;
  
  errorMessage_local.content.ptr = (char *)errorMessage.content.size_;
  errorMessage_local.content.size_ = in_RCX;
  kj::_::Debug::makeDescription<char_const(&)[33],kj::StringPtr&>
            ((String *)&local_1c0,(Debug *)"\"received bad WebSocket handshake\", errorMessage",
             "received bad WebSocket handshake",(char (*) [33])&errorMessage_local,in_R8);
  Exception::Exception
            (&exception,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f7f,(String *)&local_1c0);
  Array<char>::~Array(&local_1c0);
  local_210._8_4_ = 400;
  local_210._16_8_ = "Bad Request";
  local_210._24_8_ = (HttpServer *)0xc;
  local_210._32_8_ = errorMessage_local.content.ptr;
  local_210._40_8_ = errorMessage_local.content.size_;
  local_210._48_8_ = (Iface *)0x0;
  local_210._56_8_ = (_func_int **)0x0;
  sendError((Connection *)local_210,
            (ProtocolError)
            ZEXT4056(CONCAT832(errorMessage_local.content.size_,
                               CONCAT824(errorMessage_local.content.ptr,
                                         CONCAT816(0xc,CONCAT88("Bad Request",
                                                                CONCAT44(local_210._12_4_,400)))))))
  ;
  kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>>::
  emplace<kj::Promise<kj::HttpServer::Connection::LoopResult>>
            ((NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>> *)
             (errorMessage.content.ptr + 0x168),
             (Promise<kj::HttpServer::Connection::LoopResult> *)local_210);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_210);
  throwFatalException(&exception,0);
}

Assistant:

kj::Own<WebSocket> sendWebSocketError(StringPtr errorMessage) {
    // The client committed a protocol error during a WebSocket handshake. We will send an error
    // response back to them, and throw an exception from `acceptWebSocket()` to our app. We'll
    // label this as a DISCONNECTED exception, as if the client had simply closed the connection
    // rather than committing a protocol error. This is intended to let the server know that it
    // wasn't an error on the server's part. (This is a big of a hack...)
    kj::Exception exception = KJ_EXCEPTION(DISCONNECTED,
        "received bad WebSocket handshake", errorMessage);
    webSocketError = sendError(
        HttpHeaders::ProtocolError { 400, "Bad Request", errorMessage, nullptr });
    kj::throwFatalException(kj::mv(exception));
  }